

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O1

void __thiscall
script_segwit_tests::IsWitnessProgram_Invalid_Nop::test_method(IsWitnessProgram_Invalid_Nop *this)

{
  uint uVar1;
  pointer pbVar2;
  value_type *__val;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  const_string msg;
  CScript nowit;
  char *local_b0;
  char *local_a8;
  lazy_ostream local_a0;
  undefined1 *local_90;
  char **local_88;
  assertion_result local_80;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  undefined1 local_48 [28];
  uint uStack_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = (pointer)operator_new(10);
  pbVar2[0] = 0;
  pbVar2[1] = 0;
  pbVar2[2] = 0;
  pbVar2[3] = 0;
  pbVar2[4] = 0;
  pbVar2[5] = 0;
  pbVar2[6] = 0;
  pbVar2[7] = 0;
  local_48._16_8_ = 0;
  stack0xffffffffffffffd0 = 0;
  local_48._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
  local_48._8_8_ = 0;
  pbVar2[8] = 0;
  pbVar2[9] = 0;
  local_a0._vptr_lazy_ostream =
       (_func_int **)((ulong)local_a0._vptr_lazy_ostream & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_48,(iterator)local_48,
             (uchar *)&local_a0);
  ppVar3 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_48._0_8_;
  uVar1 = uStack_2c - 0x1d;
  if (uStack_2c < 0x1d) {
    ppVar3 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_48;
    uVar1 = uStack_2c;
  }
  local_a0._vptr_lazy_ostream = (_func_int **)CONCAT71(local_a0._vptr_lazy_ostream._1_7_,0x61);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_48,
             (uchar *)((long)&ppVar3->_union + (long)(int)uVar1),(uchar *)&local_a0);
  b._M_extent._M_extent_value = 10;
  b._M_ptr = pbVar2;
  CScript::operator<<((CScript *)local_48,b);
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x8b;
  file.m_begin = (iterator)&local_58;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_68,msg);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)anon_unknown_20::IsNoWitnessProgram((CScript *)local_48);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88 = &local_b0;
  local_b0 = "IsNoWitnessProgram(nowit)";
  local_a8 = "";
  local_a0.m_empty = false;
  local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_a0,1,0,WARN,0xec6039,(size_t)&stack0xffffffffffffff40,0x8b);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  if (0x1c < uStack_2c) {
    free((void *)local_48._0_8_);
    local_48._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
  }
  operator_delete(pbVar2,10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(IsWitnessProgram_Invalid_Nop)
{
    std::vector<unsigned char> program(10);
    CScript nowit;
    nowit << OP_0 << OP_NOP << program;
    BOOST_CHECK(IsNoWitnessProgram(nowit));
}